

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon.cxx
# Opt level: O1

void __thiscall
Fl_File_Icon::draw(Fl_File_Icon *this,int x,int y,int w,int h,Fl_Color ic,int active)

{
  short *psVar1;
  short sVar2;
  double a;
  int iVar3;
  uint uVar4;
  Fl_Color FVar5;
  Fl_Color FVar6;
  short *psVar7;
  uint c;
  short *psVar8;
  short *psVar9;
  
  if (this->num_data_ == 0) {
    return;
  }
  iVar3 = h;
  if (w < h) {
    iVar3 = w;
  }
  a = (double)iVar3;
  Fl_Graphics_Driver::push_matrix(fl_graphics_driver);
  Fl_Graphics_Driver::mult_matrix
            (fl_graphics_driver,1.0,0.0,0.0,1.0,((double)w - a) * 0.5 + (double)x,
             ((double)h + a) * 0.5 + (double)y);
  Fl_Graphics_Driver::mult_matrix(fl_graphics_driver,a,0.0,0.0,-a,0.0,0.0);
  psVar7 = this->data_;
  iVar3 = this->num_data_;
  uVar4 = ic;
  if (active == 0) {
    uVar4 = fl_inactive(ic);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)uVar4);
  FVar5 = ic;
  if (iVar3 < 1) {
    psVar8 = (short *)0x0;
  }
  else {
    psVar1 = psVar7 + iVar3;
    psVar8 = (short *)0x0;
    do {
      switch(*psVar7) {
      case 0:
        if (psVar8 != (short *)0x0) {
          switch(*psVar8) {
          case 2:
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x23])();
            break;
          case 3:
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
            break;
          case 4:
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x28])();
            break;
          case 5:
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x28])();
            uVar4 = CONCAT22(psVar8[1],psVar8[2]);
            if (active == 0) {
              c = ic;
              if (uVar4 != 0xffffffff) {
                c = uVar4;
              }
              FVar6 = fl_inactive(c);
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                        (fl_graphics_driver,(ulong)FVar6);
            }
            else {
              if (uVar4 == 0xffffffff) {
                uVar4 = ic;
              }
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                        (fl_graphics_driver,(ulong)uVar4);
            }
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
            if (psVar8[3] == 6) {
              psVar8 = psVar8 + 6;
              do {
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
                          (SUB84((double)(int)psVar8[-2] * 0.0001,0),
                           (double)(int)psVar8[-1] * 0.0001);
                sVar2 = *psVar8;
                psVar8 = psVar8 + 3;
              } while (sVar2 == 6);
            }
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,(ulong)FVar5);
          }
        }
        psVar8 = (short *)0x0;
        psVar7 = psVar7 + 1;
        break;
      case 1:
        FVar5 = CONCAT22(psVar7[1],psVar7[2]);
        if (CONCAT22(psVar7[1],psVar7[2]) == 0xffffffff) {
          FVar5 = ic;
        }
        if (active == 0) {
          FVar5 = fl_inactive(FVar5);
        }
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar5);
        psVar7 = psVar7 + 3;
        break;
      case 2:
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x19])();
        psVar8 = psVar7;
        psVar7 = psVar7 + 1;
        break;
      case 3:
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
        psVar8 = psVar7;
        psVar7 = psVar7 + 1;
        break;
      case 4:
        psVar9 = psVar7 + 1;
        goto LAB_001ac05b;
      case 5:
        psVar9 = psVar7 + 3;
LAB_001ac05b:
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x26])();
        psVar8 = psVar7;
        psVar7 = psVar9;
        break;
      case 6:
        if (psVar8 != (short *)0x0) {
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
                    (SUB84((double)(int)psVar7[1] * 0.0001,0),(double)(int)psVar7[2] * 0.0001);
        }
        psVar7 = psVar7 + 3;
        break;
      default:
        psVar7 = psVar7 + 1;
      }
    } while (psVar7 < psVar1);
  }
  if (psVar8 != (short *)0x0) {
    switch(*psVar8) {
    case 2:
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x23])();
      break;
    case 3:
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
      break;
    case 4:
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
      break;
    case 5:
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
      uVar4 = CONCAT22(psVar8[1],psVar8[2]);
      if (active == 0) {
        if (uVar4 != 0xffffffff) {
          ic = uVar4;
        }
        FVar6 = fl_inactive(ic);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar6);
      }
      else {
        if (uVar4 == 0xffffffff) {
          uVar4 = ic;
        }
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)uVar4);
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
      if (psVar8[3] == 6) {
        psVar8 = psVar8 + 6;
        do {
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
                    (SUB84((double)(int)psVar8[-2] * 0.0001,0),(double)(int)psVar8[-1] * 0.0001);
          sVar2 = *psVar8;
          psVar8 = psVar8 + 3;
        } while (sVar2 == 6);
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar5);
    }
  }
  Fl_Graphics_Driver::pop_matrix(fl_graphics_driver);
  return;
}

Assistant:

void
Fl_File_Icon::draw(int      x,		// I - Upper-lefthand X
        	   int      y,		// I - Upper-lefthand Y
		   int      w,		// I - Width of bounding box
		   int      h,		// I - Height of bounding box
        	   Fl_Color ic,		// I - Icon color...
        	   int      active)	// I - Active or inactive?
{
  Fl_Color	c,		// Current color
		oc;		// Outline color
  short		*d,		// Pointer to data
		*dend;		// End of data...
  short		*prim;		// Pointer to start of primitive...
  double	scale;		// Scale of icon


  // Don't try to draw a NULL array!
  if (num_data_ == 0)
    return;

  // Setup the transform matrix as needed...
  scale = w < h ? w : h;

  fl_push_matrix();
  fl_translate((float)x + 0.5 * ((float)w - scale),
               (float)y + 0.5 * ((float)h + scale));
  fl_scale(scale, -scale);

  // Loop through the array until we see an unmatched END...
  d    = data_;
  dend = data_ + num_data_;
  prim = NULL;
  c    = ic;

  if (active)
    fl_color(c);
  else
    fl_color(fl_inactive(c));

  while (d < dend)
    switch (*d)
    {
      case END :
          if (prim)
            switch (*prim)
	    {
	      case LINE :
		  fl_end_line();
		  break;

	      case CLOSEDLINE :
		  fl_end_loop();
		  break;

	      case POLYGON :
		  fl_end_complex_polygon();
		  break;

	      case OUTLINEPOLYGON :
		  fl_end_complex_polygon();

        	  oc = (Fl_Color)((((unsigned short *)prim)[1] << 16) | 
	                	  ((unsigned short *)prim)[2]);
                  if (active)
		  {
                    if (oc == FL_ICON_COLOR)
		      fl_color(ic);
		    else
		      fl_color(oc);
		  }
		  else
		  {
                    if (oc == FL_ICON_COLOR)
		      fl_color(fl_inactive(ic));
		    else
		      fl_color(fl_inactive(oc));
		  }

		  fl_begin_loop();

		  prim += 3;
		  while (*prim == VERTEX)
		  {
		    fl_vertex(prim[1] * 0.0001, prim[2] * 0.0001);
		    prim += 3;
		  }

        	  fl_end_loop();
		  fl_color(c);
		  break;
	    }

          prim = NULL;
	  d ++;
	  break;

      case COLOR :
          c = (Fl_Color)((((unsigned short *)d)[1] << 16) | 
	                   ((unsigned short *)d)[2]);

          if (c == FL_ICON_COLOR)
	    c = ic;

          if (!active)
	    c = fl_inactive(c);

          fl_color(c);
	  d += 3;
	  break;

      case LINE :
          prim = d;
	  d ++;
	  fl_begin_line();
	  break;

      case CLOSEDLINE :
          prim = d;
	  d ++;
	  fl_begin_loop();
	  break;

      case POLYGON :
          prim = d;
	  d ++;
	  fl_begin_complex_polygon();
	  break;

      case OUTLINEPOLYGON :
          prim = d;
	  d += 3;
	  fl_begin_complex_polygon();
	  break;

      case VERTEX :
          if (prim)
	    fl_vertex(d[1] * 0.0001, d[2] * 0.0001);
	  d += 3;
	  break;

      default : // Ignore invalid data...
          d ++;
    }

  // If we still have an open primitive, close it...
  if (prim)
    switch (*prim)
    {
      case LINE :
	  fl_end_line();
	  break;

      case CLOSEDLINE :
	  fl_end_loop();
	  break;

      case POLYGON :
	  fl_end_polygon();
	  break;

      case OUTLINEPOLYGON :
	  fl_end_polygon();

          oc = (Fl_Color)((((unsigned short *)prim)[1] << 16) | 
	                  ((unsigned short *)prim)[2]);
          if (active)
	  {
            if (oc == FL_ICON_COLOR)
	      fl_color(ic);
	    else
	      fl_color(oc);
	  }
	  else
	  {
            if (oc == FL_ICON_COLOR)
	      fl_color(fl_inactive(ic));
	    else
	      fl_color(fl_inactive(oc));
	  }

	  fl_begin_loop();

	  prim += 3;
	  while (*prim == VERTEX)
	  {
	    fl_vertex(prim[1] * 0.0001, prim[2] * 0.0001);
	    prim += 3;
	  }

          fl_end_loop();
	  fl_color(c);
	  break;
    }

  // Restore the transform matrix
  fl_pop_matrix();
}